

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O3

void Ssw_ObjAddToFrontier(Ssw_Sat_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  void **ppvVar6;
  int Fill;
  int extraout_EDX;
  int iVar7;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                  ,0x144,"void Ssw_ObjAddToFrontier(Ssw_Sat_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  pVVar3 = p->vSatVars;
  iVar7 = pObj->Id;
  Vec_IntFillExtra(pVVar3,iVar7 + 1,(int)vFrontier);
  if ((-1 < (long)iVar7) && (iVar7 < pVVar3->nSize)) {
    if (pVVar3->pArray[iVar7] == 0) {
      pVVar3 = p->vSatVars;
      iVar7 = pObj->Id;
      Vec_IntFillExtra(pVVar3,iVar7 + 1,Fill);
      if (((long)iVar7 < 0) || (pVVar3->nSize <= iVar7)) goto LAB_00613807;
      if (pVVar3->pArray[iVar7] != 0) {
        __assert_fail("Ssw_ObjSatNum(p,pObj) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                      ,0x147,"void Ssw_ObjAddToFrontier(Ssw_Sat_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      uVar5 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
      if (uVar5 != 1) {
        iVar7 = extraout_EDX;
        if (uVar5 == 2) {
          pVVar4 = p->vUsedPis;
          uVar5 = pVVar4->nSize;
          if (uVar5 == pVVar4->nCap) {
            if ((int)uVar5 < 0x10) {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar4->pArray,0x80);
              }
              pVVar4->pArray = ppvVar6;
              pVVar4->nCap = 0x10;
            }
            else {
              if (pVVar4->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar4->pArray,(ulong)uVar5 << 4);
              }
              pVVar4->pArray = ppvVar6;
              pVVar4->nCap = uVar5 * 2;
            }
          }
          else {
            ppvVar6 = pVVar4->pArray;
          }
          iVar1 = pVVar4->nSize;
          iVar7 = iVar1 + 1;
          pVVar4->nSize = iVar7;
          ppvVar6[iVar1] = pObj;
        }
        iVar1 = p->nSatVars;
        p->nSatVars = iVar1 + 1;
        pVVar3 = p->vSatVars;
        iVar2 = pObj->Id;
        Vec_IntFillExtra(pVVar3,iVar2 + 1,iVar7);
        if (((long)iVar2 < 0) || (pVVar3->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar3->pArray[iVar2] = iVar1;
        sat_solver_setnvars(p->pSat,(p->nSatVars / 100) * 100 + 100);
        if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
          uVar5 = vFrontier->nSize;
          if (uVar5 == vFrontier->nCap) {
            if ((int)uVar5 < 0x10) {
              if (vFrontier->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vFrontier->pArray,0x80);
              }
              vFrontier->pArray = ppvVar6;
              vFrontier->nCap = 0x10;
            }
            else {
              if (vFrontier->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vFrontier->pArray,(ulong)uVar5 << 4);
              }
              vFrontier->pArray = ppvVar6;
              vFrontier->nCap = uVar5 * 2;
            }
          }
          else {
            ppvVar6 = vFrontier->pArray;
          }
          iVar7 = vFrontier->nSize;
          vFrontier->nSize = iVar7 + 1;
          ppvVar6[iVar7] = pObj;
        }
      }
    }
    return;
  }
LAB_00613807:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Ssw_ObjAddToFrontier( Ssw_Sat_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    assert( Ssw_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
//    pObj->fMarkA = 1;
    // save PIs (used by register correspondence)
    if ( Aig_ObjIsCi(pObj) )
        Vec_PtrPush( p->vUsedPis, pObj );
    Ssw_ObjSetSatNum( p, pObj, p->nSatVars++ );
    sat_solver_setnvars( p->pSat, 100 * (1 + p->nSatVars / 100) );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}